

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

bool google::protobuf::internal::WireFormat::SkipField
               (CodedInputStream *input,uint32_t tag,UnknownFieldSet *unknown_fields)

{
  int iVar1;
  uint8_t *puVar2;
  byte *pbVar3;
  uint64_t *puVar4;
  uint32_t *puVar5;
  bool bVar6;
  byte bVar7;
  uint64_t value_00;
  UnknownFieldSet *unknown_fields_00;
  ulong uVar8;
  string *buffer;
  uint number;
  uint32_t first_byte_or_zero;
  pair<unsigned_long,_bool> pVar9;
  uint32_t value_1;
  uint64_t value;
  uint32_t local_34;
  uint64_t local_30;
  
  if (tag < 8) {
LAB_0030a413:
    bVar7 = 0;
    goto switchD_0030a454_caseD_4;
  }
  bVar7 = 0;
  if (5 < (tag & 7)) goto switchD_0030a454_caseD_4;
  number = tag >> 3;
  bVar7 = 0;
  switch(tag & 7) {
  case 0:
    puVar2 = input->buffer_;
    if ((puVar2 < input->buffer_end_) && (value_00 = (uint64_t)(char)*puVar2, -1 < (long)value_00))
    {
      input->buffer_ = puVar2 + 1;
      bVar7 = 1;
    }
    else {
      pVar9 = io::CodedInputStream::ReadVarint64Fallback(input);
      value_00 = pVar9.first;
      bVar7 = pVar9.second;
    }
    if ((~bVar7 & 1) != 0 || unknown_fields == (UnknownFieldSet *)0x0) break;
    UnknownFieldSet::AddVarint(unknown_fields,number,value_00);
    goto LAB_0030a619;
  case 1:
    puVar4 = (uint64_t *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar4 < 8) {
      bVar7 = io::CodedInputStream::ReadLittleEndian64Fallback(input,&local_30);
    }
    else {
      local_30 = *puVar4;
      input->buffer_ = (uint8_t *)(puVar4 + 1);
      bVar7 = true;
    }
    if ((bool)bVar7 == true && unknown_fields != (UnknownFieldSet *)0x0) {
      UnknownFieldSet::AddFixed64(unknown_fields,number,local_30);
    }
    break;
  case 2:
    pbVar3 = input->buffer_;
    if (pbVar3 < input->buffer_end_) {
      bVar7 = *pbVar3;
      uVar8 = (ulong)bVar7;
      first_byte_or_zero = (uint32_t)bVar7;
      if ((char)bVar7 < '\0') goto LAB_0030a5d0;
      input->buffer_ = pbVar3 + 1;
    }
    else {
      first_byte_or_zero = 0;
LAB_0030a5d0:
      uVar8 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
      if ((long)uVar8 < 0) goto LAB_0030a413;
    }
    if (unknown_fields == (UnknownFieldSet *)0x0) {
      bVar6 = io::CodedInputStream::Skip(input,(int)uVar8);
    }
    else {
      buffer = UnknownFieldSet::AddLengthDelimited_abi_cxx11_(unknown_fields,number);
      bVar6 = io::CodedInputStream::ReadString(input,buffer,(int)uVar8);
    }
    if (bVar6 == false) goto LAB_0030a413;
LAB_0030a619:
    bVar7 = 1;
    break;
  case 3:
    iVar1 = input->recursion_budget_;
    input->recursion_budget_ = iVar1 + -1;
    if (0 < iVar1) {
      if (unknown_fields == (UnknownFieldSet *)0x0) {
        unknown_fields_00 = (UnknownFieldSet *)0x0;
      }
      else {
        unknown_fields_00 = UnknownFieldSet::AddGroup(unknown_fields,number);
      }
      bVar6 = SkipMessage(input,unknown_fields_00);
      if (bVar6) {
        if (input->recursion_budget_ < input->recursion_limit_) {
          input->recursion_budget_ = input->recursion_budget_ + 1;
        }
        bVar7 = input->last_tag_ == (tag & 0xfffffff8 | 4);
        break;
      }
    }
    goto LAB_0030a413;
  case 5:
    puVar5 = (uint32_t *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar5 < 4) {
      bVar7 = io::CodedInputStream::ReadLittleEndian32Fallback(input,&local_34);
    }
    else {
      local_34 = *puVar5;
      input->buffer_ = (uint8_t *)(puVar5 + 1);
      bVar7 = true;
    }
    if ((bool)bVar7 == true && unknown_fields != (UnknownFieldSet *)0x0) {
      UnknownFieldSet::AddFixed32(unknown_fields,number,local_34);
    }
  }
switchD_0030a454_caseD_4:
  return (bool)(bVar7 & 1);
}

Assistant:

bool WireFormat::SkipField(io::CodedInputStream* input, uint32_t tag,
                           UnknownFieldSet* unknown_fields) {
  int number = WireFormatLite::GetTagFieldNumber(tag);
  // Field number 0 is illegal.
  if (number == 0) return false;

  switch (WireFormatLite::GetTagWireType(tag)) {
    case WireFormatLite::WIRETYPE_VARINT: {
      uint64_t value;
      if (!input->ReadVarint64(&value)) return false;
      if (unknown_fields != nullptr) unknown_fields->AddVarint(number, value);
      return true;
    }
    case WireFormatLite::WIRETYPE_FIXED64: {
      uint64_t value;
      if (!input->ReadLittleEndian64(&value)) return false;
      if (unknown_fields != nullptr) unknown_fields->AddFixed64(number, value);
      return true;
    }
    case WireFormatLite::WIRETYPE_LENGTH_DELIMITED: {
      uint32_t length;
      if (!input->ReadVarint32(&length)) return false;
      if (unknown_fields == nullptr) {
        if (!input->Skip(length)) return false;
      } else {
        if (!input->ReadString(unknown_fields->AddLengthDelimited(number),
                               length)) {
          return false;
        }
      }
      return true;
    }
    case WireFormatLite::WIRETYPE_START_GROUP: {
      if (!input->IncrementRecursionDepth()) return false;
      if (!SkipMessage(input, (unknown_fields == nullptr)
                                  ? nullptr
                                  : unknown_fields->AddGroup(number))) {
        return false;
      }
      input->DecrementRecursionDepth();
      // Check that the ending tag matched the starting tag.
      if (!input->LastTagWas(
              WireFormatLite::MakeTag(WireFormatLite::GetTagFieldNumber(tag),
                                      WireFormatLite::WIRETYPE_END_GROUP))) {
        return false;
      }
      return true;
    }
    case WireFormatLite::WIRETYPE_END_GROUP: {
      return false;
    }
    case WireFormatLite::WIRETYPE_FIXED32: {
      uint32_t value;
      if (!input->ReadLittleEndian32(&value)) return false;
      if (unknown_fields != nullptr) unknown_fields->AddFixed32(number, value);
      return true;
    }
    default: {
      return false;
    }
  }
}